

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::pipeline::anon_unknown_1::ImageViewTest::createInstance(ImageViewTest *this,Context *context)

{
  VkImageViewType viewType;
  int i;
  int iVar1;
  long lVar2;
  ImageSamplingInstance *this_00;
  IVec3 local_a4;
  UVec2 renderSize;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> vertices;
  VkSamplerCreateInfo local_78;
  
  viewType = this->m_imageViewType;
  renderSize.m_data[0] = (uint)(VK_IMAGE_VIEW_TYPE_2D < viewType) << 5 | 0x10;
  renderSize.m_data[1] = (uint)(VK_IMAGE_VIEW_TYPE_2D < viewType) * 0x10 + 0x10;
  iVar1 = 1;
  if ((viewType != VK_IMAGE_VIEW_TYPE_1D) && (viewType != VK_IMAGE_VIEW_TYPE_1D_ARRAY)) {
    if (viewType == VK_IMAGE_VIEW_TYPE_3D) {
      lVar2 = 0;
      do {
        local_a4.m_data[lVar2] = 0x10;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      goto LAB_004dcb06;
    }
    iVar1 = 0x10;
  }
  local_a4.m_data[0] = 0x10;
  local_a4.m_data[2] = 1;
  local_a4.m_data[1] = iVar1;
LAB_004dcb06:
  iVar1 = 6;
  if (viewType - VK_IMAGE_VIEW_TYPE_3D < 5) {
    iVar1 = *(int *)(&DAT_00b110c8 + (ulong)(viewType - VK_IMAGE_VIEW_TYPE_3D) * 4);
  }
  createTestQuadMosaic(&vertices,viewType);
  local_78.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  local_78.pNext = (void *)0x0;
  local_78.flags = 0;
  local_78.magFilter = VK_FILTER_NEAREST;
  local_78.minFilter = VK_FILTER_NEAREST;
  local_78.mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  local_78.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  local_78.addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  local_78.addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  local_78.mipLodBias = 0.0;
  local_78.anisotropyEnable = 0;
  local_78.maxAnisotropy = 1.0;
  local_78.compareEnable = 0;
  local_78.compareOp = VK_COMPARE_OP_NEVER;
  local_78.minLod = 0.0;
  local_78.maxLod = (float)((this->m_subresourceRange).levelCount - 1);
  local_78.borderColor = getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK,this->m_imageFormat);
  local_78.unnormalizedCoordinates = 0;
  this_00 = (ImageSamplingInstance *)operator_new(0x348);
  ImageSamplingInstance::ImageSamplingInstance
            (this_00,context,&renderSize,this->m_imageViewType,this->m_imageFormat,&local_a4,iVar1,
             &this->m_componentMapping,&this->m_subresourceRange,&local_78,this->m_samplerLod,
             &vertices,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* ImageViewTest::createInstance (Context& context) const
{
	const tcu::UVec2				renderSize		= getRenderSize(m_imageViewType);
	const tcu::IVec3				imageSize		= getImageSize(m_imageViewType);
	const int						arraySize		= getArraySize(m_imageViewType);
	const std::vector<Vertex4Tex4>	vertices		= createTestQuadMosaic(m_imageViewType);

	const VkSamplerCreateInfo		samplerParams	=
	{
		VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,									// VkStructureType			sType;
		DE_NULL,																// const void*				pNext;
		0u,																		// VkSamplerCreateFlags		flags;
		VK_FILTER_NEAREST,														// VkFilter					magFilter;
		VK_FILTER_NEAREST,														// VkFilter					minFilter;
		VK_SAMPLER_MIPMAP_MODE_NEAREST,											// VkSamplerMipmapMode		mipmapMode;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeU;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeV;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeW;
		0.0f,																	// float					mipLodBias;
		VK_FALSE,																// VkBool32					anisotropyEnable;
		1.0f,																	// float					maxAnisotropy;
		false,																	// VkBool32					compareEnable;
		VK_COMPARE_OP_NEVER,													// VkCompareOp				compareOp;
		0.0f,																	// float					minLod;
		(float)(m_subresourceRange.levelCount - 1),								// float					maxLod;
		getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK, m_imageFormat),	// VkBorderColor			borderColor;
		false																	// VkBool32					unnormalizedCoordinates;
	};

	return new ImageSamplingInstance(context, renderSize, m_imageViewType, m_imageFormat, imageSize, arraySize, m_componentMapping, m_subresourceRange, samplerParams, m_samplerLod, vertices);
}